

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

void __thiscall google::protobuf::CEscapeAndAppend(protobuf *this,StringPiece src,string *dest)

{
  long lVar1;
  byte bVar2;
  long *plVar3;
  size_type i_1;
  size_type i;
  char *pcVar4;
  char *pcVar5;
  size_t escaped_len;
  char *pcVar6;
  byte *pbVar7;
  StringPiece local_50;
  StringPiece local_40;
  
  plVar3 = (long *)src.length_;
  pcVar5 = src.ptr_;
  pcVar6 = (char *)0x0;
  local_50.ptr_ = (char *)this;
  local_50.length_ = (size_type)pcVar5;
  local_40.ptr_ = (char *)this;
  local_40.length_ = (size_type)pcVar5;
  for (pcVar4 = (char *)0x0; pcVar4 < local_40.length_; pcVar4 = pcVar4 + 1) {
    bVar2 = stringpiece_internal::StringPiece::operator[](&local_40,(size_type)pcVar4);
    pcVar6 = pcVar6 + (char)CEscapedLength(google::protobuf::stringpiece_internal::StringPiece)::
                            c_escaped_len[bVar2];
  }
  if (pcVar6 == pcVar5) {
    std::__cxx11::string::append((char *)plVar3,(ulong)this);
  }
  else {
    lVar1 = plVar3[1];
    std::__cxx11::string::resize((ulong)plVar3);
    pbVar7 = (byte *)(lVar1 + *plVar3);
    for (pcVar4 = (char *)0x0; pcVar4 < pcVar5; pcVar4 = pcVar4 + 1) {
      bVar2 = stringpiece_internal::StringPiece::operator[](&local_50,(size_type)pcVar4);
      if (bVar2 == 9) {
        pbVar7[0] = 0x5c;
        pbVar7[1] = 0x74;
LAB_002cdd77:
        pbVar7 = pbVar7 + 2;
      }
      else {
        if (bVar2 == 0x5c) {
          pbVar7[0] = 0x5c;
          pbVar7[1] = 0x5c;
          goto LAB_002cdd77;
        }
        if (bVar2 == 0xd) {
          pbVar7[0] = 0x5c;
          pbVar7[1] = 0x72;
          goto LAB_002cdd77;
        }
        if (bVar2 == 0x22) {
          pbVar7[0] = 0x5c;
          pbVar7[1] = 0x22;
          goto LAB_002cdd77;
        }
        if (bVar2 == 0x27) {
          pbVar7[0] = 0x5c;
          pbVar7[1] = 0x27;
          goto LAB_002cdd77;
        }
        if (bVar2 == 10) {
          pbVar7[0] = 0x5c;
          pbVar7[1] = 0x6e;
          goto LAB_002cdd77;
        }
        if ((byte)(bVar2 - 0x20) < 0x5f) {
          *pbVar7 = bVar2;
          pbVar7 = pbVar7 + 1;
        }
        else {
          *pbVar7 = 0x5c;
          pbVar7[1] = bVar2 >> 6 | 0x30;
          pbVar7[2] = bVar2 >> 3 & 7 | 0x30;
          pbVar7[3] = bVar2 & 7 | 0x30;
          pbVar7 = pbVar7 + 4;
        }
      }
      pcVar5 = (char *)local_50.length_;
    }
  }
  return;
}

Assistant:

void CEscapeAndAppend(StringPiece src, std::string *dest) {
  size_t escaped_len = CEscapedLength(src);
  if (escaped_len == src.size()) {
    dest->append(src.data(), src.size());
    return;
  }

  size_t cur_dest_len = dest->size();
  dest->resize(cur_dest_len + escaped_len);
  char* append_ptr = &(*dest)[cur_dest_len];

  for (StringPiece::size_type i = 0; i < src.size(); ++i) {
    unsigned char c = static_cast<unsigned char>(src[i]);
    switch (c) {
      case '\n': *append_ptr++ = '\\'; *append_ptr++ = 'n'; break;
      case '\r': *append_ptr++ = '\\'; *append_ptr++ = 'r'; break;
      case '\t': *append_ptr++ = '\\'; *append_ptr++ = 't'; break;
      case '\"': *append_ptr++ = '\\'; *append_ptr++ = '\"'; break;
      case '\'': *append_ptr++ = '\\'; *append_ptr++ = '\''; break;
      case '\\': *append_ptr++ = '\\'; *append_ptr++ = '\\'; break;
      default:
        if (!isprint(c)) {
          *append_ptr++ = '\\';
          *append_ptr++ = '0' + c / 64;
          *append_ptr++ = '0' + (c % 64) / 8;
          *append_ptr++ = '0' + c % 8;
        } else {
          *append_ptr++ = c;
        }
        break;
    }
  }
}